

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction_job.tpl.h
# Opt level: O2

bool __thiscall
r_exec::BatchReductionJob<r_exec::PrimaryMDLController,_r_exec::Fact,_r_exec::MDLController>::update
          (BatchReductionJob<r_exec::PrimaryMDLController,_r_exec::Fact,_r_exec::MDLController>
           *this,uint64_t now)

{
  _Mem *this_00;
  
  this_00 = (_Mem *)r_code::Mem::Get();
  _Mem::register_reduction_job_latency(this_00,now - (this->super__ReductionJob).ijt);
  PrimaryMDLController::reduce_batch
            ((PrimaryMDLController *)(this->processor).object,(Fact *)(this->trigger).object,
             (MDLController *)(this->controller).object);
  return true;
}

Assistant:

bool BatchReductionJob<_P, T, C>::update(uint64_t now)
{
    _Mem::Get()->register_reduction_job_latency(now - ijt);
    processor->reduce_batch(trigger, controller);
    return true;
}